

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O2

void __thiscall CTcParser::write_to_object_file(CTcParser *this,CVmFile *fp)

{
  CVmHashEntry *pCVar1;
  tcprs_nonsym_obj *ptVar2;
  CTcGramProdEntry *this_00;
  CTcPrsExport *this_01;
  long lVar3;
  CVmHashEntry **ppCVar4;
  tcprs_nonsym_obj **pptVar5;
  long lVar6;
  CTcGramProdEntry **ppCVar7;
  CTcPrsExport **ppCVar8;
  uint uVar9;
  uint v;
  tcprs_nonsym_obj **pptVar10;
  CTcPrsExport **ppCVar11;
  CVmHashEntry **ppCVar12;
  CTcGramProdEntry **ppCVar13;
  prs_wsf_ctx ctx;
  undefined8 local_48;
  CVmFile *local_40;
  CTcParser *local_38;
  
  this->obj_file_dict_idx_ = 1;
  this->obj_file_sym_idx_ = 1;
  lVar3 = CVmFile::get_pos(fp);
  uVar9 = 0;
  CVmFile::write_uint4(fp,0);
  CVmFile::write_uint4(fp,0);
  CVmFile::write_uint4(fp,0);
  local_48 = 0;
  local_40 = fp;
  local_38 = this;
  CTcPrsSymtab::enum_entries(this->global_symtab_,write_obj_cb,&local_48);
  ppCVar12 = (CVmHashEntry **)&this->anon_obj_head_;
  for (ppCVar4 = ppCVar12; (CTcSymObj *)*ppCVar4 != (CTcSymObj *)0x0;
      ppCVar4 = &(((CTcSymObj *)*ppCVar4)->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase.
                 super_CVmHashEntryCS.super_CVmHashEntry.nxt_) {
    uVar9 = uVar9 + 1;
  }
  CVmFile::write_uint4(fp,uVar9);
  ppCVar4 = ppCVar12;
  while (pCVar1 = *ppCVar4, pCVar1 != (CVmHashEntry *)0x0) {
    (*(((CTcSymObjBase *)&pCVar1->_vptr_CVmHashEntry)->super_CTcSymbol).super_CTcSymbolBase.
      super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[9])(pCVar1);
    ppCVar4 = &pCVar1->nxt_;
  }
  v = 0;
  pptVar10 = &this->nonsym_obj_head_;
  for (pptVar5 = pptVar10; *pptVar5 != (tcprs_nonsym_obj *)0x0; pptVar5 = &(*pptVar5)->nxt_) {
    v = v + 1;
  }
  CVmFile::write_uint4(fp,v);
  while (ptVar2 = *pptVar10, ptVar2 != (tcprs_nonsym_obj *)0x0) {
    CVmFile::write_uint4(fp,ptVar2->id_);
    pptVar10 = &ptVar2->nxt_;
  }
  lVar6 = CVmFile::get_pos(fp);
  CVmFile::set_pos(fp,lVar3);
  CVmFile::write_uint4(fp,this->obj_file_sym_idx_);
  CVmFile::write_uint4(fp,this->obj_file_dict_idx_);
  CVmFile::write_uint4(fp,(uint)local_48);
  CVmFile::set_pos(fp,lVar6);
  lVar3 = CVmFile::get_pos(fp);
  CVmFile::write_uint4(fp,0);
  local_48 = 0;
  CTcPrsSymtab::enum_entries(this->global_symtab_,write_obj_ref_cb,&local_48);
  lVar6 = CVmFile::get_pos(fp);
  CVmFile::set_pos(fp,lVar3);
  CVmFile::write_uint4(fp,(uint)local_48);
  CVmFile::set_pos(fp,lVar6);
  CVmFile::write_uint4(fp,uVar9);
  while (pCVar1 = *ppCVar12, pCVar1 != (CVmHashEntry *)0x0) {
    (*(((CTcSymObjBase *)&pCVar1->_vptr_CVmHashEntry)->super_CTcSymbol).super_CTcSymbolBase.
      super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[10])(pCVar1);
    ppCVar12 = &pCVar1->nxt_;
  }
  uVar9 = 0;
  ppCVar13 = &this->gramprod_head_;
  for (ppCVar7 = ppCVar13; *ppCVar7 != (CTcGramProdEntry *)0x0; ppCVar7 = &(*ppCVar7)->nxt_) {
    uVar9 = uVar9 + 1;
  }
  CVmFile::write_uint4(fp,uVar9);
  while (this_00 = *ppCVar13, this_00 != (CTcGramProdEntry *)0x0) {
    CTcGramProdEntry::write_to_obj_file(this_00,fp);
    ppCVar13 = &this_00->nxt_;
  }
  lVar3 = CVmFile::get_pos(fp);
  uVar9 = 0;
  CVmFile::write_uint4(fp,0);
  local_48 = 0;
  CTcPrsSymtab::enum_entries(this->global_symtab_,write_obj_gram_cb,&local_48);
  lVar6 = CVmFile::get_pos(fp);
  CVmFile::set_pos(fp,lVar3);
  CVmFile::write_uint4(fp,(uint)local_48);
  CVmFile::set_pos(fp,lVar6);
  ppCVar11 = &this->exp_head_;
  for (ppCVar8 = ppCVar11; *ppCVar8 != (CTcPrsExport *)0x0; ppCVar8 = &(*ppCVar8)->nxt_) {
    uVar9 = uVar9 + 1;
  }
  CVmFile::write_uint4(fp,uVar9);
  while (this_01 = *ppCVar11, this_01 != (CTcPrsExport *)0x0) {
    CTcPrsExport::write_to_obj_file(this_01,fp);
    ppCVar11 = &this_01->nxt_;
  }
  return;
}

Assistant:

void CTcParser::write_to_object_file(CVmFile *fp)
{
    prs_wsf_ctx ctx;
    long cnt_ofs;
    long end_ofs;
    ulong anon_cnt;
    ulong nonsym_cnt;
    tcprs_nonsym_obj *nonsym;
    CTcSymObj *anon_obj;
    CTcGramProdEntry *prod;
    ulong prod_cnt;
    CTcPrsExport *exp;
    ulong exp_cnt;

    /* 
     *   reset the object file symbol and dictionary index values - start
     *   with 1, since 0 is a "null pointer" index value 
     */
    obj_file_sym_idx_ = 1;
    obj_file_dict_idx_ = 1;

    /* 
     *   write a placeholder for the symbol index table count, the
     *   dictionary table count, and the actual symbol count 
     */
    cnt_ofs = fp->get_pos();
    fp->write_uint4(0);
    fp->write_uint4(0);
    fp->write_uint4(0);

    /* write each entry from the global symbol table */
    ctx.cnt = 0;
    ctx.fp = fp;
    ctx.prs = this;
    global_symtab_->enum_entries(&write_obj_cb, &ctx);

    /* count the anonymous objects */
    for (anon_cnt = 0, anon_obj = anon_obj_head_ ; anon_obj != 0 ;
         ++anon_cnt, anon_obj = (CTcSymObj *)anon_obj->nxt_) ;

    /* write the number of anonymous objects */
    fp->write_uint4(anon_cnt);

    /* write the anonymous objects */
    for (anon_obj = anon_obj_head_ ; anon_obj != 0 ;
         anon_obj = (CTcSymObj *)anon_obj->nxt_)
    {
        /* write this anonymous object */
        anon_obj->write_to_obj_file(fp);
    }

    /* count the non-symbol objects */
    for (nonsym_cnt = 0, nonsym = nonsym_obj_head_ ; nonsym != 0 ;
         ++nonsym_cnt, nonsym = nonsym->nxt_) ;

    /* write the non-symbol object ID's */
    fp->write_uint4(nonsym_cnt);
    for (nonsym = nonsym_obj_head_ ; nonsym != 0 ; nonsym = nonsym->nxt_)
        fp->write_uint4((ulong)nonsym->id_);

    /* remember where we are, and seek back to the counters for fixup */
    end_ofs = fp->get_pos();
    fp->set_pos(cnt_ofs);

    /* write the actual symbol index count */
    fp->write_uint4(obj_file_sym_idx_);

    /* write the actual dictionary index count */
    fp->write_uint4(obj_file_dict_idx_);

    /* write the total named symbol count */
    fp->write_uint4(ctx.cnt);

    /* 
     *   seek back to the ending offset so we can continue on to write the
     *   remainder of the file 
     */
    fp->set_pos(end_ofs);

    /* write a placeholder for the symbol cross-reference entries */
    cnt_ofs = fp->get_pos();
    fp->write_uint4(0);

    /* 
     *   enumerate entries again, this time writing cross-object
     *   references (this must be done after we've written out the main
     *   part of each object, so that we have a full table of all of the
     *   objects loaded before we write any references) 
     */
    ctx.cnt = 0;
    global_symtab_->enum_entries(&write_obj_ref_cb, &ctx);

    /* go back and fix up the cross-reference count */
    end_ofs = fp->get_pos();
    fp->set_pos(cnt_ofs);
    fp->write_uint4(ctx.cnt);
    fp->set_pos(end_ofs);

    /* write the anonymous object cross-references */
    fp->write_uint4(anon_cnt);
    for (anon_obj = anon_obj_head_ ; anon_obj != 0 ;
         anon_obj = (CTcSymObj *)anon_obj->nxt_)
    {
        /* write this anonymous object's cross-references */
        anon_obj->write_refs_to_obj_file(fp);
    }

    /* count the grammar productions */
    for (prod_cnt = 0, prod = gramprod_head_ ; prod != 0 ;
         ++prod_cnt, prod = prod->get_next()) ;

    /* write the number of productions */
    fp->write_uint4(prod_cnt);

    /* 
     *   write the main list of grammar rules - this is the list of
     *   productions that are associated with anonymous match objects and
     *   hence cannot be replaced or modified 
     */
    for (prod = gramprod_head_ ; prod != 0 ; prod = prod->get_next())
    {
        /* write this entry */
        prod->write_to_obj_file(fp);
    }

    /* write a placeholder for the named grammar rule count */
    cnt_ofs = fp->get_pos();
    fp->write_uint4(0);

    /* 
     *   write the private grammar rules - this is the set of rules
     *   associated with named match objects, so we write these by
     *   enumerating the symbol table again through the grammar rule writer
     *   callback 
     */
    ctx.cnt = 0;
    global_symtab_->enum_entries(&write_obj_gram_cb, &ctx);

    /* go back and fix up the named grammar rule count */
    end_ofs = fp->get_pos();
    fp->set_pos(cnt_ofs);
    fp->write_uint4(ctx.cnt);
    fp->set_pos(end_ofs);

    /* count the exports */
    for (exp_cnt = 0, exp = exp_head_ ; exp != 0 ;
         ++exp_cnt, exp = exp->get_next());

    /* write the number of exports */
    fp->write_uint4(exp_cnt);

    /* write the exports */
    for (exp = exp_head_ ; exp != 0 ; exp = exp->get_next())
    {
        /* write this entry */
        exp->write_to_obj_file(fp);
    }
}